

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::deriveEDDSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_KEY_TYPE keyType,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  uchar uVar1;
  CK_ATTRIBUTE_TYPE CVar2;
  void *pvVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  Session *this_00;
  ulong uVar7;
  CryptoFactory *pCVar8;
  SoftHSM *pSVar9;
  EDPrivateKey *privateKey;
  uchar *puVar10;
  EDPublicKey *publicKey;
  long *plVar11;
  ByteString *in;
  size_t sVar12;
  byte *pbVar13;
  unsigned_long *puVar14;
  CK_ULONG ulCount_00;
  CK_ULONG CVar15;
  byte bVar16;
  ulong uVar17;
  size_t i;
  bool bVar18;
  SoftHSM *this_01;
  char *pcVar19;
  CK_RV CVar20;
  bool bVar21;
  bool bVar22;
  ByteString secretValue;
  ByteString plainKCV;
  ByteString kcv;
  ByteString value;
  CK_OBJECT_CLASS objClass;
  ByteString publicData;
  CK_ATTRIBUTE secretAttribs [32];
  ulong local_6f0;
  long *local_6d8;
  SoftHSM *local_6d0;
  OSObject *local_6c8;
  Token *local_6c0;
  ByteString local_6b8;
  CK_RV local_690;
  ByteString local_688;
  ByteString local_660;
  ByteString local_638;
  undefined8 local_610;
  ByteString local_608;
  undefined1 local_5e0 [160];
  OSAttribute local_540;
  ByteString local_4a0;
  OSAttribute local_478;
  OSAttribute local_3d8;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  CK_KEY_TYPE *local_2e8;
  undefined8 local_2e0;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  *phKey = 0;
  plVar11 = (long *)pMechanism->pParameter;
  if ((plVar11 == (long *)0x0) || (pMechanism->ulParameterLen != 0x28)) {
    pcVar19 = "pParameter must be of type CK_ECDH1_DERIVE_PARAMS";
    iVar6 = 0x2ada;
LAB_00147225:
    softHSMLog(7,"deriveEDDSA",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar6,pcVar19);
    return 0x71;
  }
  if (*plVar11 != 1) {
    pcVar19 = "kdf must be CKD_NULL";
    iVar6 = 0x2adf;
    goto LAB_00147225;
  }
  if ((plVar11[1] != 0) || (plVar11[2] != 0)) {
    pcVar19 = "there must be no shared data";
    iVar6 = 0x2ae5;
    goto LAB_00147225;
  }
  if ((plVar11[3] == 0) || (plVar11[4] == 0)) {
    pcVar19 = "there must be a public data";
    iVar6 = 0x2aeb;
    goto LAB_00147225;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_6d0 = this;
  local_6c0 = Session::getToken(this_00);
  CVar20 = 5;
  if (local_6c0 == (Token *)0x0) {
    return 5;
  }
  bVar21 = ulCount != 0;
  if (ulCount == 0) {
    uVar7 = 0;
    bVar18 = true;
  }
  else {
    puVar14 = &pTemplate->ulValueLen;
    bVar18 = true;
    uVar7 = 0;
    uVar17 = 1;
    do {
      CVar2 = ((_CK_ATTRIBUTE *)(puVar14 + -2))->type;
      if (CVar2 == 0x90) {
        if (*puVar14 != 0) {
          pcVar19 = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
          iVar6 = 0x2b0e;
LAB_00147411:
          softHSMLog(6,"deriveEDDSA",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,iVar6,pcVar19);
          CVar20 = 0x13;
          break;
        }
        bVar18 = false;
      }
      else if (CVar2 == 0x161) {
        if (*puVar14 != 8) {
          pcVar19 = "CKA_VALUE_LEN does not have the size of CK_ULONG";
          iVar6 = 0x2b06;
          goto LAB_00147411;
        }
        uVar7 = *(ulong *)puVar14[-1];
      }
      else if (CVar2 == 0x11) {
        softHSMLog(6,"deriveEDDSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2b01,"CKA_VALUE must not be included");
        CVar20 = 0x10;
        break;
      }
      bVar21 = uVar17 < ulCount;
      puVar14 = puVar14 + 3;
      bVar22 = uVar17 != ulCount;
      uVar17 = uVar17 + 1;
    } while (bVar22);
  }
  if (bVar21) {
    return CVar20;
  }
  local_6f0 = uVar7;
  switch(keyType) {
  case 0x10:
    break;
  case 0x11:
  case 0x12:
    return 0x13;
  case 0x13:
    if ((uVar7 & 0xfffffffffffffff7) != 0) {
      pcVar19 = "CKA_VALUE_LEN must be 0 or 8";
      iVar6 = 0x2b22;
LAB_0014753f:
      softHSMLog(6,"deriveEDDSA",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar6,pcVar19);
      return 0x13;
    }
    local_6f0 = 8;
    break;
  case 0x14:
    if ((uVar7 & 0xffffffffffffffef) != 0) {
      pcVar19 = "CKA_VALUE_LEN must be 0 or 16";
      iVar6 = 0x2b2b;
      goto LAB_0014753f;
    }
    local_6f0 = 0x10;
    break;
  case 0x15:
    local_6f0 = 0x18;
    if ((uVar7 != 0) && (uVar7 != 0x18)) {
      pcVar19 = "CKA_VALUE_LEN must be 0 or 24";
      iVar6 = 0x2b33;
      goto LAB_0014753f;
    }
    break;
  default:
    if (keyType != 0x1f) {
      return 0x13;
    }
    uVar7 = uVar7 << 0x3d | uVar7 >> 3;
    if ((4 < uVar7) || (uVar7 == 1)) {
      pcVar19 = "CKA_VALUE_LEN must be 0, 16, 24, or 32";
      iVar6 = 0x2b3b;
      goto LAB_0014753f;
    }
  }
  local_6c8 = (OSObject *)HandleManager::getObject(local_6d0->handleManager,hBaseKey);
  if (local_6c8 == (OSObject *)0x0) {
    return 0x60;
  }
  iVar6 = (*local_6c8->_vptr_OSObject[10])(local_6c8);
  if ((char)iVar6 == '\0') {
    return 0x60;
  }
  pCVar8 = CryptoFactory::i();
  iVar6 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,7);
  pSVar9 = (SoftHSM *)CONCAT44(extraout_var,iVar6);
  if (pSVar9 == (SoftHSM *)0x0) {
    return 0x70;
  }
  this_01 = pSVar9;
  iVar6 = (*pSVar9->_vptr_SoftHSM[0x16])();
  privateKey = (EDPrivateKey *)CONCAT44(extraout_var_00,iVar6);
  if (privateKey == (EDPrivateKey *)0x0) {
    pCVar8 = CryptoFactory::i();
    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,pSVar9);
    return 2;
  }
  CVar20 = getEDPrivateKey(this_01,privateKey,local_6c0,local_6c8);
  if (CVar20 != 0) {
    (*pSVar9->_vptr_SoftHSM[0x1b])(pSVar9,privateKey);
    pCVar8 = CryptoFactory::i();
    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,pSVar9);
    return 5;
  }
  ByteString::ByteString(&local_608);
  ByteString::resize(&local_608,*(size_t *)((long)pMechanism->pParameter + 0x18));
  puVar10 = ByteString::operator[](&local_608,0);
  memcpy(puVar10,*(void **)((long)pMechanism->pParameter + 0x20),
         *(size_t *)((long)pMechanism->pParameter + 0x18));
  iVar6 = (*pSVar9->_vptr_SoftHSM[0x15])();
  publicKey = (EDPublicKey *)CONCAT44(extraout_var_01,iVar6);
  if (publicKey == (EDPublicKey *)0x0) {
    (*pSVar9->_vptr_SoftHSM[0x1b])(pSVar9,privateKey);
    pCVar8 = CryptoFactory::i();
    CVar20 = 2;
    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,pSVar9);
    goto LAB_00147718;
  }
  CVar20 = getEDDHPublicKey(local_6d0,publicKey,privateKey,&local_608);
  if (CVar20 != 0) {
    (*pSVar9->_vptr_SoftHSM[0x1b])(pSVar9,privateKey);
    (*pSVar9->_vptr_SoftHSM[0x1a])(pSVar9,publicKey);
    pCVar8 = CryptoFactory::i();
    CVar20 = 5;
    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,pSVar9);
    goto LAB_00147718;
  }
  local_6d8 = (long *)0x0;
  iVar6 = (*pSVar9->_vptr_SoftHSM[0x10])(pSVar9,&local_6d8,publicKey,privateKey);
  (*pSVar9->_vptr_SoftHSM[0x1b])(pSVar9,privateKey);
  (*pSVar9->_vptr_SoftHSM[0x1a])();
  local_690 = (ulong)(byte)((byte)iVar6 ^ 1) * 5;
  local_610 = 4;
  memset(&local_338,0,0x300);
  local_338.ulValueLen = 8;
  uVar7 = 1;
  local_320 = 1;
  local_318 = &isOnToken;
  local_310 = 1;
  local_308 = 2;
  local_300 = &isPrivate;
  local_2f8 = 1;
  local_2f0 = 0x100;
  local_2e8 = &keyType;
  local_2e0 = 8;
  CVar20 = 0xd1;
  if (ulCount < 0x1d) {
    CVar20 = local_690;
  }
  bVar16 = ulCount < 0x1d & (byte)iVar6;
  ulCount_00 = 4;
  CVar15 = ulCount_00;
  if (ulCount != 0 && bVar16 == 1) {
    do {
      uVar17 = pTemplate->type;
      ulCount_00 = CVar15;
      if (((2 < uVar17) && (uVar17 != 0x90)) && (uVar17 != 0x100)) {
        ulCount_00 = CVar15 + 1;
        (&local_338)[CVar15].ulValueLen = pTemplate->ulValueLen;
        pvVar3 = pTemplate->pValue;
        (&local_338)[CVar15].type = pTemplate->type;
        (&local_338)[CVar15].pValue = pvVar3;
      }
      bVar21 = uVar7 < ulCount;
      uVar7 = uVar7 + 1;
      pTemplate = pTemplate + 1;
      CVar15 = ulCount_00;
    } while ((bVar16 & bVar21) != 0);
  }
  local_338.pValue = &local_610;
  if (bVar16 != 0) {
    CVar20 = CreateObject(local_6d0,hSession,&local_338,ulCount_00,phKey,3);
  }
  if (CVar20 == 0) {
    plVar11 = (long *)HandleManager::getObject(local_6d0->handleManager,*phKey);
    CVar20 = 6;
    if (((plVar11 != (long *)0x0) &&
        (cVar4 = (**(code **)(*plVar11 + 0x50))(plVar11), cVar4 != '\0')) &&
       (cVar4 = (**(code **)(*plVar11 + 0x58))(plVar11), cVar4 != '\0')) {
      OSAttribute::OSAttribute(&local_540,false);
      cVar4 = (**(code **)(*plVar11 + 0x40))(plVar11,0x163,&local_540);
      OSAttribute::~OSAttribute(&local_540);
      iVar6 = (*local_6c8->_vptr_OSObject[4])(local_6c8,0x165,0);
      if ((char)iVar6 == '\0') {
        if (cVar4 == '\0') goto LAB_00147a59;
        OSAttribute::OSAttribute(&local_540,false);
        cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x165,&local_540);
      }
      else {
        bVar21 = (bool)(**(code **)(*plVar11 + 0x20))(plVar11,0x103,0);
        if (cVar4 == '\0') {
LAB_00147a59:
          cVar5 = '\0';
        }
        else {
          OSAttribute::OSAttribute(&local_540,bVar21);
          cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x165,&local_540);
        }
      }
      if (cVar4 != '\0') {
        OSAttribute::~OSAttribute(&local_540);
      }
      iVar6 = (*local_6c8->_vptr_OSObject[4])(local_6c8,0x164,1);
      if ((char)iVar6 == '\0') {
        if (cVar5 == '\0') goto LAB_00147af5;
        OSAttribute::OSAttribute(&local_478,false);
        cVar4 = (**(code **)(*plVar11 + 0x40))(plVar11,0x164,&local_478);
      }
      else {
        bVar16 = (**(code **)(*plVar11 + 0x20))(plVar11,0x162,0);
        if (cVar5 == '\0') {
LAB_00147af5:
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute(&local_478,(bool)(bVar16 ^ 1));
          cVar4 = (**(code **)(*plVar11 + 0x40))(plVar11,0x164,&local_478);
        }
      }
      if (cVar5 != '\0') {
        OSAttribute::~OSAttribute(&local_478);
      }
      in = (ByteString *)(**(code **)(*local_6d8 + 0x20))();
      ByteString::ByteString(&local_6b8,in);
      ByteString::ByteString(&local_638);
      ByteString::ByteString(&local_688);
      ByteString::ByteString(&local_660);
      if (local_6f0 == 0) {
        if (keyType == 0x10) {
          local_6f0 = ByteString::size(&local_6b8);
        }
        else if (keyType == 0x1f) {
          sVar12 = ByteString::size(&local_6b8);
          local_6f0 = 0x20;
          if (sVar12 < 0x20) {
            sVar12 = ByteString::size(&local_6b8);
            local_6f0 = (ulong)(0x17 < sVar12) * 8 + 0x10;
          }
        }
        else {
          local_6f0 = 0;
        }
      }
      sVar12 = ByteString::size(&local_6b8);
      if (sVar12 < local_6f0) {
        cVar4 = '\0';
        softHSMLog(6,"deriveEDDSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2bd2,"The derived secret is too short");
      }
      else {
        sVar12 = ByteString::size(&local_6b8);
        if (local_6f0 < sVar12) {
          sVar12 = ByteString::size(&local_6b8);
          ByteString::split(&local_4a0,&local_6b8,sVar12 - local_6f0);
          local_4a0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_4a0.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        }
        if (keyType - 0x13 < 3) {
          for (uVar7 = 0; sVar12 = ByteString::size(&local_6b8), uVar7 < sVar12; uVar7 = uVar7 + 1)
          {
            pbVar13 = ByteString::operator[](&local_6b8,uVar7);
            uVar1 = odd_parity[*pbVar13];
            puVar10 = ByteString::operator[](&local_6b8,uVar7);
            *puVar10 = uVar1;
          }
        }
        if (keyType - 0x13 < 3) {
          (**(code **)(*local_6d8 + 0x30))(local_6d8,local_6f0 * 7);
          (**(code **)(*local_6d8 + 0x28))(local_5e0);
          ByteString::operator=(&local_688,(ByteString *)local_5e0);
LAB_00147d93:
          local_5e0._0_8_ = &PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_5e0 + 8)
                    );
        }
        else {
          if (keyType == 0x1f) {
            (**(code **)(*local_6d8 + 0x30))(local_6d8,local_6f0 << 3);
            (**(code **)(*local_6d8 + 0x28))(local_5e0);
            ByteString::operator=(&local_688,(ByteString *)local_5e0);
            goto LAB_00147d93;
          }
          if (keyType == 0x10) {
            (**(code **)(*local_6d8 + 0x30))(local_6d8,local_6f0 << 3);
            (**(code **)(*local_6d8 + 0x28))(local_5e0);
            ByteString::operator=(&local_688,(ByteString *)local_5e0);
            goto LAB_00147d93;
          }
          cVar4 = '\0';
        }
        if (isPrivate == '\0') {
          ByteString::operator=(&local_638,&local_6b8);
          ByteString::operator=(&local_660,&local_688);
        }
        else {
          Token::encrypt(local_6c0,(char *)&local_6b8,(int)&local_638);
          Token::encrypt(local_6c0,(char *)&local_688,(int)&local_660);
        }
      }
      if (cVar4 == '\0') {
        cVar4 = '\0';
      }
      else {
        OSAttribute::OSAttribute((OSAttribute *)local_5e0,&local_638);
        cVar4 = (**(code **)(*plVar11 + 0x40))(plVar11,0x11,local_5e0);
        OSAttribute::~OSAttribute((OSAttribute *)local_5e0);
      }
      if (bVar18) {
        if (cVar4 == '\0') {
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute(&local_3d8,&local_660);
          cVar4 = (**(code **)(*plVar11 + 0x40))(plVar11,0x90,&local_3d8);
          OSAttribute::~OSAttribute(&local_3d8);
        }
      }
      if (cVar4 == '\0') {
        (**(code **)(*plVar11 + 0x68))(plVar11);
        cVar4 = '\0';
      }
      else {
        cVar4 = (**(code **)(*plVar11 + 0x60))(plVar11);
      }
      CVar20 = 6;
      if (cVar4 != '\0') {
        CVar20 = 0;
      }
      local_660._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_660.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_688._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_688.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_638._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_638.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_6b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_6b8.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  (*pSVar9->_vptr_SoftHSM[0x1c])(pSVar9,local_6d8);
  pCVar8 = CryptoFactory::i();
  (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,pSVar9);
  if ((CVar20 != 0) && (*phKey != 0)) {
    plVar11 = (long *)HandleManager::getObject(local_6d0->handleManager,*phKey);
    HandleManager::destroyObject(local_6d0->handleManager,*phKey);
    if (plVar11 != (long *)0x0) {
      (**(code **)(*plVar11 + 0x70))(plVar11);
    }
    *phKey = 0;
  }
LAB_00147718:
  local_608._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_608.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar20;
}

Assistant:

CK_RV SoftHSM::deriveEDDSA
(CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_KEY_TYPE keyType,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	if ((pMechanism->pParameter == NULL_PTR) ||
	    (pMechanism->ulParameterLen != sizeof(CK_ECDH1_DERIVE_PARAMS)))
	{
		DEBUG_MSG("pParameter must be of type CK_ECDH1_DERIVE_PARAMS");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->kdf != CKD_NULL)
	{
		DEBUG_MSG("kdf must be CKD_NULL");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulSharedDataLen != 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pSharedData != NULL_PTR))
	{
		DEBUG_MSG("there must be no shared data");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen == 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData == NULL_PTR))
	{
		DEBUG_MSG("there must be a public data");
		return CKR_MECHANISM_PARAM_INVALID;
	}

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t byteLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE:
				INFO_MSG("CKA_VALUE must not be included");
				return CKR_ATTRIBUTE_READ_ONLY;
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				byteLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Check the length
	// byteLen == 0 impiles return max size the ECC can derive
	switch (keyType)
	{
		case CKK_GENERIC_SECRET:
			break;
#ifndef WITH_FIPS
		case CKK_DES:
			if (byteLen != 0 && byteLen != 8)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 8");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 8;
			break;
#endif
		case CKK_DES2:
			if (byteLen != 0 && byteLen != 16)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 16");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 16;
			break;
		case CKK_DES3:
			if (byteLen != 0 && byteLen != 24)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 24");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 24;
			break;
		case CKK_AES:
			if (byteLen != 0 && byteLen != 16 && byteLen != 24 && byteLen != 32)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0, 16, 24, or 32");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Get the base key handle
	OSObject *baseKey = (OSObject *)handleManager->getObject(hBaseKey);
	if (baseKey == NULL || !baseKey->isValid())
		return CKR_KEY_HANDLE_INVALID;

	// Get the EDDSA algorithm handler
	AsymmetricAlgorithm* eddsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
	if (eddsa == NULL)
		return CKR_MECHANISM_INVALID;

	// Get the keys
	PrivateKey* privateKey = eddsa->newPrivateKey();
	if (privateKey == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_HOST_MEMORY;
	}
	if (getEDPrivateKey((EDPrivateKey*)privateKey, token, baseKey) != CKR_OK)
	{
		eddsa->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_GENERAL_ERROR;
	}

	ByteString publicData;
	publicData.resize(CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	memcpy(&publicData[0],
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData,
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	PublicKey* publicKey = eddsa->newPublicKey();
	if (publicKey == NULL)
	{
		eddsa->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_HOST_MEMORY;
	}
	if (getEDDHPublicKey((EDPublicKey*)publicKey, (EDPrivateKey*)privateKey, publicData) != CKR_OK)
	{
		eddsa->recyclePrivateKey(privateKey);
		eddsa->recyclePublicKey(publicKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);
		return CKR_GENERAL_ERROR;
	}

	// Derive the secret
	SymmetricKey* secret = NULL;
	CK_RV rv = CKR_OK;
	if (!eddsa->deriveKey(&secret, publicKey, privateKey))
		rv = CKR_GENERAL_ERROR;
	eddsa->recyclePrivateKey(privateKey);
	eddsa->recyclePublicKey(publicKey);

	// Create the secret object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, phKey, OBJECT_OP_DERIVE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,false);

			// Common Secret Key Attributes
			if (baseKey->getBooleanValue(CKA_ALWAYS_SENSITIVE, false))
			{
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,false);
			}
			if (baseKey->getBooleanValue(CKA_NEVER_EXTRACTABLE, true))
			{
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,bNeverExtractable);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,false);
			}

			// Secret Attributes
			ByteString secretValue = secret->getKeyBits();
			ByteString value;
			ByteString plainKCV;
			ByteString kcv;

			// For generic and AES keys:
			// default to return max size available.
			if (byteLen == 0)
			{
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						byteLen = secretValue.size();
						break;
					case CKK_AES:
						if (secretValue.size() >= 32)
							byteLen = 32;
						else if (secretValue.size() >= 24)
							byteLen = 24;
						else
							byteLen = 16;
				}
			}

			if (byteLen > secretValue.size())
			{
				INFO_MSG("The derived secret is too short");
				bOK = false;
			}
			else
			{
				// Truncate value when requested, remove from the leading end
				if (byteLen < secretValue.size())
					secretValue.split(secretValue.size() - byteLen);

				// Fix the odd parity for DES
				if (keyType == CKK_DES ||
				    keyType == CKK_DES2 ||
				    keyType == CKK_DES3)
				{
					for (size_t i = 0; i < secretValue.size(); i++)
					{
						secretValue[i] = odd_parity[secretValue[i]];
					}
				}

				// Get the KCV
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						secret->setBitLen(byteLen * 8);
						plainKCV = secret->getKeyCheckValue();
						break;
					case CKK_DES:
					case CKK_DES2:
					case CKK_DES3:
						secret->setBitLen(byteLen * 7);
						plainKCV = ((DESKey*)secret)->getKeyCheckValue();
						break;
					case CKK_AES:
						secret->setBitLen(byteLen * 8);
						plainKCV = ((AESKey*)secret)->getKeyCheckValue();
						break;
					default:
						bOK = false;
						break;
				}

				if (isPrivate)
				{
					token->encrypt(secretValue, value);
					token->encrypt(plainKCV, kcv);
				}
				else
				{
					value = secretValue;
					kcv = plainKCV;
				}
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	eddsa->recycleSymmetricKey(secret);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(eddsa);

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* ossecret = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (ossecret) ossecret->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}